

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<unsigned_short,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  undefined2 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pointer pSVar19;
  ulong uVar20;
  ulong uVar21;
  _func_int **pp_Var22;
  _func_int **pp_Var23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar37;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar38;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar50 [16];
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar81;
  int iVar83;
  undefined1 auVar82 [16];
  
  pSVar19 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar19 + 3));
  p_Var3 = pSVar19[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar19[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar18 = _DAT_01dd8ba0;
  auVar17 = _DAT_01dd7b40;
  auVar16 = _DAT_01dd7b30;
  uVar27 = scan_count + result_offset;
  auVar28 = extraout_XMM0;
  do {
    uVar20 = uVar27 - result_offset;
    if (uVar27 < result_offset || uVar20 == 0) {
      return;
    }
    pp_Var6 = pSVar19[4]._vptr_SegmentScanState;
    pp_Var22 = pSVar19[5]._vptr_SegmentScanState;
    pp_Var23 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + uVar2 + iVar4);
    uVar21 = (long)pp_Var23 - (long)pp_Var22;
    uVar1 = *(undefined2 *)(p_Var3 + (long)pp_Var6 * 2 + iVar4 + 8);
    if (uVar20 < uVar21) {
      lVar24 = uVar20 + (uVar20 == 0);
      lVar25 = lVar24 + -1;
      auVar47._8_4_ = (int)lVar25;
      auVar47._0_8_ = lVar25;
      auVar47._12_4_ = (int)((ulong)lVar25 >> 0x20);
      lVar25 = result_offset * 2;
      auVar47 = auVar47 ^ auVar17;
      uVar26 = 0;
      auVar57 = auVar16;
      auVar65 = auVar18;
      auVar54 = _DAT_01dd8b90;
      auVar56 = _DAT_01dd8b80;
      do {
        auVar28 = auVar57 ^ auVar17;
        iVar37 = auVar47._0_4_;
        auVar42._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
        iVar38 = auVar47._4_4_;
        auVar42._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
        iVar48 = auVar47._8_4_;
        auVar42._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
        iVar49 = auVar47._12_4_;
        auVar42._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
        auVar72._4_4_ = auVar42._0_4_;
        auVar72._0_4_ = auVar42._0_4_;
        auVar72._8_4_ = auVar42._8_4_;
        auVar72._12_4_ = auVar42._8_4_;
        auVar79 = pshuflw(in_XMM14,auVar72,0xe8);
        auVar33._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
        auVar33._4_4_ = -(uint)(auVar28._4_4_ == iVar38);
        auVar33._8_4_ = -(uint)(auVar28._8_4_ == iVar48);
        auVar33._12_4_ = -(uint)(auVar28._12_4_ == iVar49);
        auVar59._4_4_ = auVar33._4_4_;
        auVar59._0_4_ = auVar33._4_4_;
        auVar59._8_4_ = auVar33._12_4_;
        auVar59._12_4_ = auVar33._12_4_;
        auVar33 = pshuflw(auVar33,auVar59,0xe8);
        auVar60._4_4_ = auVar42._4_4_;
        auVar60._0_4_ = auVar42._4_4_;
        auVar60._8_4_ = auVar42._12_4_;
        auVar60._12_4_ = auVar42._12_4_;
        auVar42 = pshuflw(auVar42,auVar60,0xe8);
        auVar28._8_4_ = 0xffffffff;
        auVar28._0_8_ = 0xffffffffffffffff;
        auVar28._12_4_ = 0xffffffff;
        auVar28 = (auVar42 | auVar33 & auVar79) ^ auVar28;
        auVar28 = packssdw(auVar28,auVar28);
        if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25) = uVar1;
        }
        auVar60 = auVar59 & auVar72 | auVar60;
        auVar28 = packssdw(auVar60,auVar60);
        auVar79._8_4_ = 0xffffffff;
        auVar79._0_8_ = 0xffffffffffffffff;
        auVar79._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 ^ auVar79,auVar28 ^ auVar79);
        if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 2) = uVar1;
        }
        auVar28 = auVar65 ^ auVar17;
        auVar43._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
        auVar43._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
        auVar43._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
        auVar43._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
        auVar61._4_4_ = auVar43._0_4_;
        auVar61._0_4_ = auVar43._0_4_;
        auVar61._8_4_ = auVar43._8_4_;
        auVar61._12_4_ = auVar43._8_4_;
        iVar81 = -(uint)(auVar28._4_4_ == iVar38);
        iVar83 = -(uint)(auVar28._12_4_ == iVar49);
        auVar73._4_4_ = iVar81;
        auVar73._0_4_ = iVar81;
        auVar73._8_4_ = iVar83;
        auVar73._12_4_ = iVar83;
        auVar80._4_4_ = auVar43._4_4_;
        auVar80._0_4_ = auVar43._4_4_;
        auVar80._8_4_ = auVar43._12_4_;
        auVar80._12_4_ = auVar43._12_4_;
        auVar28 = auVar73 & auVar61 | auVar80;
        auVar28 = packssdw(auVar28,auVar28);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 ^ auVar12,auVar28 ^ auVar12);
        if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 4) = uVar1;
        }
        auVar28 = pshufhw(auVar28,auVar61,0x84);
        auVar42 = pshufhw(auVar43,auVar73,0x84);
        auVar33 = pshufhw(auVar28,auVar80,0x84);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar34 = (auVar33 | auVar42 & auVar28) ^ auVar34;
        auVar28 = packssdw(auVar34,auVar34);
        if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 6) = uVar1;
        }
        auVar28 = auVar54 ^ auVar17;
        auVar44._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
        auVar44._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
        auVar44._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
        auVar44._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
        auVar74._4_4_ = auVar44._0_4_;
        auVar74._0_4_ = auVar44._0_4_;
        auVar74._8_4_ = auVar44._8_4_;
        auVar74._12_4_ = auVar44._8_4_;
        auVar42 = pshuflw(auVar80,auVar74,0xe8);
        auVar35._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
        auVar35._4_4_ = -(uint)(auVar28._4_4_ == iVar38);
        auVar35._8_4_ = -(uint)(auVar28._8_4_ == iVar48);
        auVar35._12_4_ = -(uint)(auVar28._12_4_ == iVar49);
        auVar62._4_4_ = auVar35._4_4_;
        auVar62._0_4_ = auVar35._4_4_;
        auVar62._8_4_ = auVar35._12_4_;
        auVar62._12_4_ = auVar35._12_4_;
        auVar28 = pshuflw(auVar35,auVar62,0xe8);
        auVar63._4_4_ = auVar44._4_4_;
        auVar63._0_4_ = auVar44._4_4_;
        auVar63._8_4_ = auVar44._12_4_;
        auVar63._12_4_ = auVar44._12_4_;
        auVar33 = pshuflw(auVar44,auVar63,0xe8);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 & auVar42,(auVar33 | auVar28 & auVar42) ^ auVar13);
        if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 8) = uVar1;
        }
        auVar63 = auVar62 & auVar74 | auVar63;
        auVar33 = packssdw(auVar63,auVar63);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28,auVar33 ^ auVar14);
        if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 10) = uVar1;
        }
        auVar28 = auVar56 ^ auVar17;
        auVar45._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
        auVar45._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
        auVar45._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
        auVar45._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
        auVar64._4_4_ = auVar45._0_4_;
        auVar64._0_4_ = auVar45._0_4_;
        auVar64._8_4_ = auVar45._8_4_;
        auVar64._12_4_ = auVar45._8_4_;
        iVar37 = -(uint)(auVar28._4_4_ == iVar38);
        iVar38 = -(uint)(auVar28._12_4_ == iVar49);
        auVar75._4_4_ = iVar37;
        auVar75._0_4_ = iVar37;
        auVar75._8_4_ = iVar38;
        auVar75._12_4_ = iVar38;
        in_XMM14._4_4_ = auVar45._4_4_;
        in_XMM14._0_4_ = auVar45._4_4_;
        in_XMM14._8_4_ = auVar45._12_4_;
        in_XMM14._12_4_ = auVar45._12_4_;
        auVar28 = auVar75 & auVar64 | in_XMM14;
        auVar28 = packssdw(auVar28,auVar28);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 ^ auVar15,auVar28 ^ auVar15);
        if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 0xc) = uVar1;
        }
        auVar28 = pshufhw(auVar28,auVar64,0x84);
        in_XMM1 = pshufhw(auVar45,auVar75,0x84);
        in_XMM1 = in_XMM1 & auVar28;
        auVar28 = pshufhw(auVar28,in_XMM14,0x84);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar28 | in_XMM1) ^ auVar36;
        auVar28 = packssdw(auVar36,auVar36);
        if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 0xe) = uVar1;
        }
        uVar26 = uVar26 + 8;
        lVar51 = auVar57._8_8_;
        auVar57._0_8_ = auVar57._0_8_ + 8;
        auVar57._8_8_ = lVar51 + 8;
        lVar51 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + 8;
        auVar65._8_8_ = lVar51 + 8;
        lVar51 = auVar54._8_8_;
        auVar54._0_8_ = auVar54._0_8_ + 8;
        auVar54._8_8_ = lVar51 + 8;
        lVar51 = auVar56._8_8_;
        auVar56._0_8_ = auVar56._0_8_ + 8;
        auVar56._8_8_ = lVar51 + 8;
      } while ((lVar24 + 7U & 0xfffffffffffffff8) != uVar26);
      pp_Var22 = (_func_int **)((long)pp_Var22 + uVar20);
    }
    else {
      if (pp_Var23 != pp_Var22) {
        lVar25 = uVar21 - 1;
        auVar46._8_4_ = (int)lVar25;
        auVar46._0_8_ = lVar25;
        auVar46._12_4_ = (int)((ulong)lVar25 >> 0x20);
        lVar25 = result_offset * 2;
        uVar26 = 0;
        auVar50 = auVar16;
        auVar52 = auVar18;
        auVar53 = _DAT_01dd8b90;
        auVar55 = _DAT_01dd8b80;
        do {
          auVar57 = auVar46 ^ auVar17;
          auVar65 = auVar50 ^ auVar17;
          iVar37 = auVar57._0_4_;
          iVar81 = -(uint)(iVar37 < auVar65._0_4_);
          iVar38 = auVar57._4_4_;
          auVar67._4_4_ = -(uint)(iVar38 < auVar65._4_4_);
          iVar48 = auVar57._8_4_;
          iVar83 = -(uint)(iVar48 < auVar65._8_4_);
          iVar49 = auVar57._12_4_;
          auVar67._12_4_ = -(uint)(iVar49 < auVar65._12_4_);
          auVar76._4_4_ = iVar81;
          auVar76._0_4_ = iVar81;
          auVar76._8_4_ = iVar83;
          auVar76._12_4_ = iVar83;
          auVar28 = pshuflw(auVar28,auVar76,0xe8);
          auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar38);
          auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar49);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar65 = pshuflw(in_XMM1,auVar66,0xe8);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar57 = pshuflw(auVar28,auVar67,0xe8);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar57 | auVar65 & auVar28) ^ auVar29;
          auVar28 = packssdw(auVar29,auVar29);
          if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25) = uVar1;
          }
          auVar67 = auVar66 & auVar76 | auVar67;
          auVar28 = packssdw(auVar67,auVar67);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar28 = packssdw(auVar28 ^ auVar7,auVar28 ^ auVar7);
          if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 2) = uVar1;
          }
          auVar28 = auVar52 ^ auVar17;
          auVar39._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
          auVar39._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
          auVar39._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
          auVar39._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
          auVar68._4_4_ = auVar39._0_4_;
          auVar68._0_4_ = auVar39._0_4_;
          auVar68._8_4_ = auVar39._8_4_;
          auVar68._12_4_ = auVar39._8_4_;
          iVar81 = -(uint)(auVar28._4_4_ == iVar38);
          iVar83 = -(uint)(auVar28._12_4_ == iVar49);
          auVar77._4_4_ = iVar81;
          auVar77._0_4_ = iVar81;
          auVar77._8_4_ = iVar83;
          auVar77._12_4_ = iVar83;
          auVar82._4_4_ = auVar39._4_4_;
          auVar82._0_4_ = auVar39._4_4_;
          auVar82._8_4_ = auVar39._12_4_;
          auVar82._12_4_ = auVar39._12_4_;
          auVar28 = auVar77 & auVar68 | auVar82;
          auVar28 = packssdw(auVar28,auVar28);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar28 = packssdw(auVar28 ^ auVar8,auVar28 ^ auVar8);
          if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 4) = uVar1;
          }
          auVar28 = pshufhw(auVar28,auVar68,0x84);
          auVar65 = pshufhw(auVar39,auVar77,0x84);
          auVar57 = pshufhw(auVar28,auVar82,0x84);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar30 = (auVar57 | auVar65 & auVar28) ^ auVar30;
          auVar28 = packssdw(auVar30,auVar30);
          if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 6) = uVar1;
          }
          auVar28 = auVar53 ^ auVar17;
          auVar40._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
          auVar40._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
          auVar40._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
          auVar40._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
          auVar78._4_4_ = auVar40._0_4_;
          auVar78._0_4_ = auVar40._0_4_;
          auVar78._8_4_ = auVar40._8_4_;
          auVar78._12_4_ = auVar40._8_4_;
          auVar65 = pshuflw(auVar82,auVar78,0xe8);
          auVar31._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
          auVar31._4_4_ = -(uint)(auVar28._4_4_ == iVar38);
          auVar31._8_4_ = -(uint)(auVar28._8_4_ == iVar48);
          auVar31._12_4_ = -(uint)(auVar28._12_4_ == iVar49);
          auVar69._4_4_ = auVar31._4_4_;
          auVar69._0_4_ = auVar31._4_4_;
          auVar69._8_4_ = auVar31._12_4_;
          auVar69._12_4_ = auVar31._12_4_;
          auVar28 = pshuflw(auVar31,auVar69,0xe8);
          auVar70._4_4_ = auVar40._4_4_;
          auVar70._0_4_ = auVar40._4_4_;
          auVar70._8_4_ = auVar40._12_4_;
          auVar70._12_4_ = auVar40._12_4_;
          auVar57 = pshuflw(auVar40,auVar70,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar28 = packssdw(auVar28 & auVar65,(auVar57 | auVar28 & auVar65) ^ auVar9);
          if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 8) = uVar1;
          }
          auVar70 = auVar69 & auVar78 | auVar70;
          auVar57 = packssdw(auVar70,auVar70);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar28 = packssdw(auVar28,auVar57 ^ auVar10);
          if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 10) = uVar1;
          }
          auVar28 = auVar55 ^ auVar17;
          auVar41._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
          auVar41._4_4_ = -(uint)(iVar38 < auVar28._4_4_);
          auVar41._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
          auVar41._12_4_ = -(uint)(iVar49 < auVar28._12_4_);
          auVar71._4_4_ = auVar41._0_4_;
          auVar71._0_4_ = auVar41._0_4_;
          auVar71._8_4_ = auVar41._8_4_;
          auVar71._12_4_ = auVar41._8_4_;
          iVar37 = -(uint)(auVar28._4_4_ == iVar38);
          iVar38 = -(uint)(auVar28._12_4_ == iVar49);
          auVar58._4_4_ = iVar37;
          auVar58._0_4_ = iVar37;
          auVar58._8_4_ = iVar38;
          auVar58._12_4_ = iVar38;
          in_XMM14._4_4_ = auVar41._4_4_;
          in_XMM14._0_4_ = auVar41._4_4_;
          in_XMM14._8_4_ = auVar41._12_4_;
          in_XMM14._12_4_ = auVar41._12_4_;
          auVar28 = auVar58 & auVar71 | in_XMM14;
          auVar28 = packssdw(auVar28,auVar28);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar28 = packssdw(auVar28 ^ auVar11,auVar28 ^ auVar11);
          if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 0xc) = uVar1;
          }
          auVar28 = pshufhw(auVar28,auVar71,0x84);
          in_XMM1 = pshufhw(auVar41,auVar58,0x84);
          in_XMM1 = in_XMM1 & auVar28;
          auVar28 = pshufhw(auVar28,in_XMM14,0x84);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar32 = (auVar28 | in_XMM1) ^ auVar32;
          auVar28 = packssdw(auVar32,auVar32);
          if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar26 * 2 + lVar25 + 0xe) = uVar1;
          }
          uVar26 = uVar26 + 8;
          lVar24 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 8;
          auVar50._8_8_ = lVar24 + 8;
          lVar24 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 8;
          auVar52._8_8_ = lVar24 + 8;
          lVar24 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 8;
          auVar53._8_8_ = lVar24 + 8;
          lVar24 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + 8;
          auVar55._8_8_ = lVar24 + 8;
        } while ((uVar21 + 7 & 0xfffffffffffffff8) != uVar26);
      }
      result_offset = result_offset + uVar21;
      pSVar19[4]._vptr_SegmentScanState = (_func_int **)((long)pp_Var6 + 1);
      pp_Var22 = (_func_int **)0x0;
    }
    pSVar19[5]._vptr_SegmentScanState = pp_Var22;
  } while (uVar21 <= uVar20);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}